

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryInt::test
          (ShaderBitfieldOperationCaseUnaryInt *this,Data *data)

{
  GLuint *pGVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  bool bVar5;
  long lVar6;
  
  bVar5 = this->m_components < 1;
  if ((0 < this->m_components) &&
     (GVar2 = (*this->m_func)(data->inIvec4[0]), data->outIvec4[0] == GVar2)) {
    lVar6 = 0x21;
    do {
      iVar3 = (int)lVar6 + -0x20;
      bVar5 = this->m_components <= iVar3;
      if (this->m_components <= iVar3) {
        return bVar5;
      }
      GVar4 = (*this->m_func)(data->inUvec4[lVar6 + -0x1c]);
      pGVar1 = data->inUvec4 + lVar6;
      lVar6 = lVar6 + 1;
    } while (*pGVar1 == GVar4);
  }
  return bVar5;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = m_func(data->inIvec4[i]);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}